

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfskmsscreen.cpp
# Opt level: O2

QList<QPlatformScreen::Mode> * __thiscall
QEglFSKmsScreen::modes(QList<QPlatformScreen::Mode> *__return_storage_ptr__,QEglFSKmsScreen *this)

{
  long lVar1;
  drmModeModeInfo *info;
  _drmModeModeInfo *p_Var2;
  long in_FS_OFFSET;
  Mode local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (Mode *)0x0;
  (__return_storage_ptr__->d).size = 0;
  QList<QPlatformScreen::Mode>::reserve(__return_storage_ptr__,(this->m_output).modes.d.size);
  p_Var2 = (this->m_output).modes.d.ptr;
  for (lVar1 = (this->m_output).modes.d.size * 0x44; lVar1 != 0; lVar1 = lVar1 + -0x44) {
    local_38.size.wd.m_i = (int)p_Var2->hdisplay;
    local_38.size.ht.m_i = (int)p_Var2->vdisplay;
    local_38.refreshRate = 60.0;
    if (p_Var2->vrefresh != 0) {
      local_38.refreshRate = (qreal)p_Var2->vrefresh;
    }
    QList<QPlatformScreen::Mode>::emplaceBack<QPlatformScreen::Mode>
              (__return_storage_ptr__,&local_38);
    p_Var2 = p_Var2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QPlatformScreen::Mode> QEglFSKmsScreen::modes() const
{
    QList<QPlatformScreen::Mode> list;
    list.reserve(m_output.modes.size());

    for (const drmModeModeInfo &info : std::as_const(m_output.modes))
        list.append({QSize(info.hdisplay, info.vdisplay),
                     qreal(info.vrefresh > 0 ? info.vrefresh : 60)});

    return list;
}